

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * __thiscall
ON_Xform::operator*(ON_Xform *__return_storage_ptr__,ON_Xform *this,ON_Xform *rhs)

{
  double *p;
  double m [4] [4];
  ON_Xform *rhs_local;
  ON_Xform *this_local;
  
  p = (double *)
      (this->m_xform[0][3] * rhs->m_xform[3][0] +
      this->m_xform[0][2] * rhs->m_xform[2][0] +
      this->m_xform[0][0] * rhs->m_xform[0][0] + this->m_xform[0][1] * rhs->m_xform[1][0]);
  m[0][0] = this->m_xform[0][3] * rhs->m_xform[3][1] +
            this->m_xform[0][2] * rhs->m_xform[2][1] +
            this->m_xform[0][0] * rhs->m_xform[0][1] + this->m_xform[0][1] * rhs->m_xform[1][1];
  m[0][1] = this->m_xform[0][3] * rhs->m_xform[3][2] +
            this->m_xform[0][2] * rhs->m_xform[2][2] +
            this->m_xform[0][0] * rhs->m_xform[0][2] + this->m_xform[0][1] * rhs->m_xform[1][2];
  m[0][2] = this->m_xform[0][3] * rhs->m_xform[3][3] +
            this->m_xform[0][2] * rhs->m_xform[2][3] +
            this->m_xform[0][0] * rhs->m_xform[0][3] + this->m_xform[0][1] * rhs->m_xform[1][3];
  m[0][3] = this->m_xform[1][3] * rhs->m_xform[3][0] +
            this->m_xform[1][2] * rhs->m_xform[2][0] +
            this->m_xform[1][0] * rhs->m_xform[0][0] + this->m_xform[1][1] * rhs->m_xform[1][0];
  m[1][0] = this->m_xform[1][3] * rhs->m_xform[3][1] +
            this->m_xform[1][2] * rhs->m_xform[2][1] +
            this->m_xform[1][0] * rhs->m_xform[0][1] + this->m_xform[1][1] * rhs->m_xform[1][1];
  m[1][1] = this->m_xform[1][3] * rhs->m_xform[3][2] +
            this->m_xform[1][2] * rhs->m_xform[2][2] +
            this->m_xform[1][0] * rhs->m_xform[0][2] + this->m_xform[1][1] * rhs->m_xform[1][2];
  m[1][2] = this->m_xform[1][3] * rhs->m_xform[3][3] +
            this->m_xform[1][2] * rhs->m_xform[2][3] +
            this->m_xform[1][0] * rhs->m_xform[0][3] + this->m_xform[1][1] * rhs->m_xform[1][3];
  m[1][3] = this->m_xform[2][3] * rhs->m_xform[3][0] +
            this->m_xform[2][2] * rhs->m_xform[2][0] +
            this->m_xform[2][0] * rhs->m_xform[0][0] + this->m_xform[2][1] * rhs->m_xform[1][0];
  m[2][0] = this->m_xform[2][3] * rhs->m_xform[3][1] +
            this->m_xform[2][2] * rhs->m_xform[2][1] +
            this->m_xform[2][0] * rhs->m_xform[0][1] + this->m_xform[2][1] * rhs->m_xform[1][1];
  m[2][1] = this->m_xform[2][3] * rhs->m_xform[3][2] +
            this->m_xform[2][2] * rhs->m_xform[2][2] +
            this->m_xform[2][0] * rhs->m_xform[0][2] + this->m_xform[2][1] * rhs->m_xform[1][2];
  m[2][2] = this->m_xform[2][3] * rhs->m_xform[3][3] +
            this->m_xform[2][2] * rhs->m_xform[2][3] +
            this->m_xform[2][0] * rhs->m_xform[0][3] + this->m_xform[2][1] * rhs->m_xform[1][3];
  m[2][3] = this->m_xform[3][3] * rhs->m_xform[3][0] +
            this->m_xform[3][2] * rhs->m_xform[2][0] +
            this->m_xform[3][0] * rhs->m_xform[0][0] + this->m_xform[3][1] * rhs->m_xform[1][0];
  m[3][0] = this->m_xform[3][3] * rhs->m_xform[3][1] +
            this->m_xform[3][2] * rhs->m_xform[2][1] +
            this->m_xform[3][0] * rhs->m_xform[0][1] + this->m_xform[3][1] * rhs->m_xform[1][1];
  m[3][1] = this->m_xform[3][3] * rhs->m_xform[3][2] +
            this->m_xform[3][2] * rhs->m_xform[2][2] +
            this->m_xform[3][0] * rhs->m_xform[0][2] + this->m_xform[3][1] * rhs->m_xform[1][2];
  m[3][2] = this->m_xform[3][3] * rhs->m_xform[3][3] +
            this->m_xform[3][2] * rhs->m_xform[2][3] +
            this->m_xform[3][0] * rhs->m_xform[0][3] + this->m_xform[3][1] * rhs->m_xform[1][3];
  m[3][3] = (double)rhs;
  ON_Xform(__return_storage_ptr__,(double (*) [4])&p);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Xform::operator*( const ON_Xform& rhs ) const
{
  double m[4][4];
  const double* p = &rhs.m_xform[0][0];

  m[0][0] = m_xform[0][0]*p[0] + m_xform[0][1]*p[4] + m_xform[0][2]*p[ 8] + m_xform[0][3]*p[12];
  m[0][1] = m_xform[0][0]*p[1] + m_xform[0][1]*p[5] + m_xform[0][2]*p[ 9] + m_xform[0][3]*p[13];
  m[0][2] = m_xform[0][0]*p[2] + m_xform[0][1]*p[6] + m_xform[0][2]*p[10] + m_xform[0][3]*p[14];
  m[0][3] = m_xform[0][0]*p[3] + m_xform[0][1]*p[7] + m_xform[0][2]*p[11] + m_xform[0][3]*p[15];

  m[1][0] = m_xform[1][0]*p[0] + m_xform[1][1]*p[4] + m_xform[1][2]*p[ 8] + m_xform[1][3]*p[12];
  m[1][1] = m_xform[1][0]*p[1] + m_xform[1][1]*p[5] + m_xform[1][2]*p[ 9] + m_xform[1][3]*p[13];
  m[1][2] = m_xform[1][0]*p[2] + m_xform[1][1]*p[6] + m_xform[1][2]*p[10] + m_xform[1][3]*p[14];
  m[1][3] = m_xform[1][0]*p[3] + m_xform[1][1]*p[7] + m_xform[1][2]*p[11] + m_xform[1][3]*p[15];

  m[2][0] = m_xform[2][0]*p[0] + m_xform[2][1]*p[4] + m_xform[2][2]*p[ 8] + m_xform[2][3]*p[12];
  m[2][1] = m_xform[2][0]*p[1] + m_xform[2][1]*p[5] + m_xform[2][2]*p[ 9] + m_xform[2][3]*p[13];
  m[2][2] = m_xform[2][0]*p[2] + m_xform[2][1]*p[6] + m_xform[2][2]*p[10] + m_xform[2][3]*p[14];
  m[2][3] = m_xform[2][0]*p[3] + m_xform[2][1]*p[7] + m_xform[2][2]*p[11] + m_xform[2][3]*p[15];

  m[3][0] = m_xform[3][0]*p[0] + m_xform[3][1]*p[4] + m_xform[3][2]*p[ 8] + m_xform[3][3]*p[12];
  m[3][1] = m_xform[3][0]*p[1] + m_xform[3][1]*p[5] + m_xform[3][2]*p[ 9] + m_xform[3][3]*p[13];
  m[3][2] = m_xform[3][0]*p[2] + m_xform[3][1]*p[6] + m_xform[3][2]*p[10] + m_xform[3][3]*p[14];
  m[3][3] = m_xform[3][0]*p[3] + m_xform[3][1]*p[7] + m_xform[3][2]*p[11] + m_xform[3][3]*p[15];

  return ON_Xform(m);
}